

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O3

char * varinfo(lua_State *L,TValue *o)

{
  CallInfo *ci;
  lua_CFunction p_Var1;
  StkId pTVar2;
  Proto *p;
  int lastpc;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  char *local_28;
  
  local_28 = (char *)0x0;
  ci = L->ci;
  if ((ci->callstatus & 2) == 0) {
LAB_0011669d:
    return "";
  }
  if (ci->func->tt_ == 0x8006) {
    p_Var1 = (ci->func->value_).f;
    if (p_Var1[8] == (_func_int_lua_State_ptr)0x6) {
      if ((ulong)(byte)p_Var1[10] != 0) {
        uVar6 = 0;
        do {
          if ((TValue *)**(long **)(p_Var1 + uVar6 * 8 + 0x20) == o) {
            pcVar4 = upvalname(*(Proto **)(p_Var1 + 0x18),(int)uVar6);
            pcVar3 = "upvalue";
            goto LAB_001166c3;
          }
          uVar6 = uVar6 + 1;
        } while ((byte)p_Var1[10] != uVar6);
      }
      pTVar2 = (ci->u).l.base;
      lVar5 = (long)o - (long)pTVar2;
      if ((-1 < lVar5) && (lVar5 < (long)ci->top - (long)pTVar2)) {
        p = *(Proto **)(p_Var1 + 0x18);
        lastpc = currentpc(ci);
        pcVar3 = getobjname(p,lastpc,(int)((ulong)((long)o - (long)(ci->u).l.base) >> 4),&local_28);
        pcVar4 = local_28;
        if (pcVar3 != (char *)0x0) {
LAB_001166c3:
          pcVar4 = luaO_pushfstring(L," (%s \'%s\')",pcVar3,pcVar4);
          return pcVar4;
        }
      }
      goto LAB_0011669d;
    }
    pcVar4 = "((((ci)->func)->value_).gc)->tt == ((6) | ((0) << 4))";
  }
  else {
    pcVar4 = "(((((ci)->func))->tt_) == (((((6) | ((0) << 4))) | (1 << 15))))";
  }
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                ,0x25c,"const char *getupvalname(CallInfo *, const TValue *, const char **)");
}

Assistant:

static const char *varinfo (lua_State *L, const TValue *o) {
  const char *name = NULL;  /* to avoid warnings */
  CallInfo *ci = L->ci;
  const char *kind = NULL;
  if (isLua(ci)) {
    kind = getupvalname(ci, o, &name);  /* check whether 'o' is an upvalue */
    if (!kind && isinstack(ci, o))  /* no? try a register */
      kind = getobjname(ci_func(ci)->p, currentpc(ci),
                        cast_int(o - ci->u.l.base), &name);
  }
  return (kind) ? luaO_pushfstring(L, " (%s '%s')", kind, name) : "";
}